

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT3D.c
# Opt level: O2

uint32_t FACT3DInitialize(FACTAudioEngine *pEngine,uint8_t *F3DInstance)

{
  uint16_t nIndex;
  float nSpeedOfSound;
  FAudioWaveFormatExtensible wfxFinalMixFormat;
  float local_4c;
  FAudioWaveFormatExtensible local_48;
  
  if (pEngine != (FACTAudioEngine *)0x0) {
    nIndex = FACTAudioEngine_GetGlobalVariableIndex(pEngine,"SpeedOfSound");
    FACTAudioEngine_GetGlobalVariable(pEngine,nIndex,&local_4c);
    FACTAudioEngine_GetFinalMixFormat(pEngine,&local_48);
    F3DAudioInitialize(local_48.dwChannelMask,local_4c,F3DInstance);
  }
  return 0;
}

Assistant:

uint32_t FACT3DInitialize(
	FACTAudioEngine *pEngine,
	F3DAUDIO_HANDLE F3DInstance
) {
	float nSpeedOfSound;
	FAudioWaveFormatExtensible wfxFinalMixFormat;

	if (pEngine == NULL)
	{
		return 0;
	}

	FACTAudioEngine_GetGlobalVariable(
		pEngine,
		FACTAudioEngine_GetGlobalVariableIndex(
			pEngine,
			"SpeedOfSound"
		),
		&nSpeedOfSound
	);
	FACTAudioEngine_GetFinalMixFormat(
		pEngine,
		&wfxFinalMixFormat
	);
	F3DAudioInitialize(
		wfxFinalMixFormat.dwChannelMask,
		nSpeedOfSound,
		F3DInstance
	);
	return 0;
}